

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_shader_module
          (DisasmReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  pointer ppVVar1;
  pointer ppVVar2;
  bool bVar3;
  VkResult VVar4;
  mapped_type *pmVar5;
  VkShaderModuleCreateInfo *create_info_local;
  Hash hash_local;
  
  create_info_local = create_info;
  hash_local = hash;
  bVar3 = shader_module_is_active(this,hash);
  if (bVar3) {
    if (this->device == (VulkanDevice *)0x0) {
      *module = (VkShaderModule)hash;
    }
    else {
      fprintf(_stderr,"Fossilize INFO: Creating shader module 0%lX\n",hash);
      fflush(_stderr);
      VVar4 = (*vkCreateShaderModule)
                        (this->device->device,create_info,(VkAllocationCallbacks *)0x0,module);
      if (VVar4 != VK_SUCCESS) {
        fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
        fflush(_stderr);
        return false;
      }
      fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
      fflush(_stderr);
    }
    ppVVar1 = (this->shader_modules).
              super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVVar2 = (this->shader_modules).
              super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar5 = std::__detail::
             _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->module_to_index,module);
    *pmVar5 = (mapped_type)((ulong)((long)ppVVar1 - (long)ppVVar2) >> 3);
    std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::push_back
              (&this->shader_modules,module);
    std::vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
    ::push_back(&this->shader_module_infos,&create_info_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->module_hashes,&hash_local);
  }
  else {
    *module = (VkShaderModule)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		if (!shader_module_is_active(hash))
		{
			*module = fake_handle<VkShaderModule>(hash);
			return true;
		}

		if (device)
		{
			LOGI("Creating shader module 0%" PRIX64 "\n", hash);
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*module = fake_handle<VkShaderModule>(hash);

		module_to_index[*module] = shader_modules.size();
		shader_modules.push_back(*module);
		shader_module_infos.push_back(create_info);
		module_hashes.push_back(hash);
		return true;
	}